

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O0

CURLcode override_login(Curl_easy *data,connectdata *conn,char **userp,char **passwdp,
                       char **optionsp)

{
  int iVar1;
  CURLcode CVar2;
  char *pcVar3;
  bool bVar4;
  _Bool local_42;
  _Bool local_41;
  int ret;
  _Bool netrc_passwd_changed;
  _Bool netrc_user_changed;
  CURLUcode uc;
  _Bool passwd_changed;
  _Bool user_changed;
  char **optionsp_local;
  char **passwdp_local;
  char **userp_local;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  netrc_user_changed = false;
  netrc_passwd_changed = false;
  _uc = optionsp;
  optionsp_local = passwdp;
  passwdp_local = userp;
  userp_local = (char **)conn;
  conn_local = (connectdata *)data;
  if (((data->set).use_netrc == CURL_NETRC_REQUIRED) &&
     ((*(uint *)&(conn->bits).field_0x4 >> 7 & 1) != 0)) {
    bVar4 = *userp != (char *)0x0;
    if (bVar4) {
      (*Curl_cfree)(*userp);
      *passwdp_local = (char *)0x0;
    }
    netrc_user_changed = bVar4;
    if (*optionsp_local != (char *)0x0) {
      (*Curl_cfree)(*optionsp_local);
      *optionsp_local = (char *)0x0;
      netrc_passwd_changed = true;
    }
    *(uint *)((long)userp_local + 0x3b4) = *(uint *)((long)userp_local + 0x3b4) & 0xffffff7f;
  }
  if (conn_local[2].conn_to_host.rawalloc != (char *)0x0) {
    (*Curl_cfree)(*passwdp_local);
    pcVar3 = (*Curl_cstrdup)(conn_local[2].conn_to_host.rawalloc);
    *passwdp_local = pcVar3;
    if (*passwdp_local == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    *(uint *)((long)userp_local + 0x3b4) = *(uint *)((long)userp_local + 0x3b4) & 0xffffff7f | 0x80;
    netrc_user_changed = true;
  }
  if (conn_local[2].conn_to_host.encalloc != (char *)0x0) {
    (*Curl_cfree)(*optionsp_local);
    pcVar3 = (*Curl_cstrdup)(conn_local[2].conn_to_host.encalloc);
    *optionsp_local = pcVar3;
    if (*optionsp_local == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    *(uint *)((long)userp_local + 0x3b4) = *(uint *)((long)userp_local + 0x3b4) & 0xffffff7f | 0x80;
    netrc_passwd_changed = true;
  }
  if (conn_local[2].conn_to_host.name != (char *)0x0) {
    (*Curl_cfree)(*_uc);
    pcVar3 = (*Curl_cstrdup)(conn_local[2].conn_to_host.name);
    *_uc = pcVar3;
    if (*_uc == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
  }
  *(uint *)((long)userp_local + 0x3b4) = *(uint *)((long)userp_local + 0x3b4) & 0xffefffff;
  if ((*(int *)((long)&conn_local[1].proto + 0xa0) != 0) &&
     ((((*passwdp_local == (char *)0x0 || (**passwdp_local == '\0')) ||
       (*optionsp_local == (char *)0x0)) || (**optionsp_local == '\0')))) {
    local_41 = false;
    local_42 = false;
    iVar1 = Curl_parsenetrc(userp_local[0x1a],passwdp_local,optionsp_local,&local_41,&local_42,
                            *(char **)(conn_local[2].chunk.hexbuffer + 0x10));
    if (iVar1 < 1) {
      if (iVar1 < 0) {
        return CURLE_OUT_OF_MEMORY;
      }
      *(uint *)((long)userp_local + 0x3b4) =
           *(uint *)((long)userp_local + 0x3b4) & 0xffefffff | 0x100000;
      *(uint *)((long)userp_local + 0x3b4) =
           *(uint *)((long)userp_local + 0x3b4) & 0xffffff7f | 0x80;
      if ((local_41 & 1U) != 0) {
        netrc_user_changed = true;
      }
      if ((local_42 & 1U) != 0) {
        netrc_passwd_changed = true;
      }
    }
    else {
      Curl_infof((Curl_easy *)conn_local,
                 "Couldn\'t find host %s in the .netrc file; using defaults\n",userp_local[0x1a]);
    }
  }
  if ((netrc_user_changed & 1U) != 0) {
    ret = curl_url_set((CURLU *)conn_local[3].lastused.tv_sec,CURLUPART_USER,*passwdp_local,0);
    if (ret != CURLUE_OK) {
      CVar2 = Curl_uc_to_curlcode(ret);
      return CVar2;
    }
    ret = 0;
  }
  if (((netrc_passwd_changed & 1U) == 0) ||
     (ret = curl_url_set((CURLU *)conn_local[3].lastused.tv_sec,CURLUPART_PASSWORD,*optionsp_local,0
                        ), ret == CURLUE_OK)) {
    data_local._4_4_ = CURLE_OK;
  }
  else {
    data_local._4_4_ = Curl_uc_to_curlcode(ret);
  }
  return data_local._4_4_;
}

Assistant:

static CURLcode override_login(struct Curl_easy *data,
                               struct connectdata *conn,
                               char **userp, char **passwdp, char **optionsp)
{
  bool user_changed = FALSE;
  bool passwd_changed = FALSE;
  CURLUcode uc;

  if(data->set.use_netrc == CURL_NETRC_REQUIRED && conn->bits.user_passwd) {
    /* ignore user+password in the URL */
    if(*userp) {
      Curl_safefree(*userp);
      user_changed = TRUE;
    }
    if(*passwdp) {
      Curl_safefree(*passwdp);
      passwd_changed = TRUE;
    }
    conn->bits.user_passwd = FALSE; /* disable user+password */
  }

  if(data->set.str[STRING_USERNAME]) {
    free(*userp);
    *userp = strdup(data->set.str[STRING_USERNAME]);
    if(!*userp)
      return CURLE_OUT_OF_MEMORY;
    conn->bits.user_passwd = TRUE; /* enable user+password */
    user_changed = TRUE;
  }

  if(data->set.str[STRING_PASSWORD]) {
    free(*passwdp);
    *passwdp = strdup(data->set.str[STRING_PASSWORD]);
    if(!*passwdp)
      return CURLE_OUT_OF_MEMORY;
    conn->bits.user_passwd = TRUE; /* enable user+password */
    passwd_changed = TRUE;
  }

  if(data->set.str[STRING_OPTIONS]) {
    free(*optionsp);
    *optionsp = strdup(data->set.str[STRING_OPTIONS]);
    if(!*optionsp)
      return CURLE_OUT_OF_MEMORY;
  }

  conn->bits.netrc = FALSE;
  if(data->set.use_netrc != CURL_NETRC_IGNORED &&
      (!*userp || !**userp || !*passwdp || !**passwdp)) {
    bool netrc_user_changed = FALSE;
    bool netrc_passwd_changed = FALSE;
    int ret;

    ret = Curl_parsenetrc(conn->host.name,
                          userp, passwdp,
                          &netrc_user_changed, &netrc_passwd_changed,
                          data->set.str[STRING_NETRC_FILE]);
    if(ret > 0) {
      infof(data, "Couldn't find host %s in the "
            DOT_CHAR "netrc file; using defaults\n",
            conn->host.name);
    }
    else if(ret < 0) {
      return CURLE_OUT_OF_MEMORY;
    }
    else {
      /* set bits.netrc TRUE to remember that we got the name from a .netrc
         file, so that it is safe to use even if we followed a Location: to a
         different host or similar. */
      conn->bits.netrc = TRUE;
      conn->bits.user_passwd = TRUE; /* enable user+password */

      if(netrc_user_changed) {
        user_changed = TRUE;
      }
      if(netrc_passwd_changed) {
        passwd_changed = TRUE;
      }
    }
  }

  /* for updated strings, we update them in the URL */
  if(user_changed) {
    uc = curl_url_set(data->state.uh, CURLUPART_USER, *userp, 0);
    if(uc)
      return Curl_uc_to_curlcode(uc);
  }
  if(passwd_changed) {
    uc = curl_url_set(data->state.uh, CURLUPART_PASSWORD, *passwdp, 0);
    if(uc)
      return Curl_uc_to_curlcode(uc);
  }
  return CURLE_OK;
}